

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteAiger(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Aig_Man_t *pAig_00;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Abc_Ntk_t *pTemp;
  Aig_Man_t *pCan;
  Aig_Man_t *pAig;
  uint local_40;
  int c;
  int fVerbose;
  int fUnique;
  int fCompact;
  int fWriteSymbols;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUnique = 0;
  fVerbose = 0;
  c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"scuvh"), iVar1 != -1) {
    switch(iVar1) {
    case 99:
      fVerbose = fVerbose ^ 1;
      break;
    default:
      goto LAB_00339545;
    case 0x68:
      goto LAB_00339545;
    case 0x73:
      fUnique = fUnique ^ 1;
      break;
    case 0x75:
      c = c ^ 1;
      break;
    case 0x76:
      local_40 = local_40 ^ 1;
    }
  }
  if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
    fprintf((FILE *)pAbc->Out,"Empty network.\n");
    pAbc_local._4_4_ = 0;
  }
  else if (argc == globalUtilOptind + 1) {
    pcVar2 = argv[globalUtilOptind];
    iVar1 = Abc_NtkIsStrash(pAbc->pNtkCur);
    if (iVar1 == 0) {
      fprintf(_stdout,"Writing this format is only possible for structurally hashed AIGs.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (c == 0) {
        Io_WriteAiger(pAbc->pNtkCur,pcVar2,fUnique,fVerbose,0);
      }
      else {
        pAig_00 = Abc_NtkToDar(pAbc->pNtkCur,0,1);
        pMan = Saig_ManDupIsoCanonical(pAig_00,local_40);
        pNtk = Abc_NtkFromAigPhase(pMan);
        Aig_ManStop(pMan);
        Aig_ManStop(pAig_00);
        Io_WriteAiger(pNtk,pcVar2,fUnique,fVerbose,c);
        Abc_NtkDelete(pNtk);
      }
      pAbc_local._4_4_ = 0;
    }
  }
  else {
LAB_00339545:
    fprintf((FILE *)pAbc->Err,"usage: write_aiger [-scuvh] <file>\n");
    fprintf((FILE *)pAbc->Err,
            "\t         writes the network in the AIGER format (http://fmv.jku.at/aiger)\n");
    pcVar2 = "no";
    if (fUnique != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-s     : toggle saving I/O names [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (fVerbose != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle writing more compactly [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (c != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-u     : toggle writing canonical AIG structure [default = %s]\n",
            pcVar2);
    pcVar2 = "no";
    if (local_40 != 0) {
      pcVar2 = "yes";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
            pcVar2);
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write (extension .aig)\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteAiger( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int fWriteSymbols;
    int fCompact;
    int fUnique;
    int fVerbose;
    int c;

    fWriteSymbols = 0;
    fCompact      = 0;
    fUnique       = 0;
    fVerbose      = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "scuvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 's':
                fWriteSymbols ^= 1;
                break;
            case 'c':
                fCompact ^= 1;
                break;
            case 'u':
                fUnique ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    if ( !Abc_NtkIsStrash(pAbc->pNtkCur) )
    {
        fprintf( stdout, "Writing this format is only possible for structurally hashed AIGs.\n" );
        return 1;
    }
    if ( fUnique )
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        extern Abc_Ntk_t * Abc_NtkFromAigPhase( Aig_Man_t * pMan );
        Aig_Man_t * pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        Aig_Man_t * pCan = Saig_ManDupIsoCanonical( pAig, fVerbose );
        Abc_Ntk_t * pTemp = Abc_NtkFromAigPhase( pCan );
        Aig_ManStop( pCan );
        Aig_ManStop( pAig );
        Io_WriteAiger( pTemp, pFileName, fWriteSymbols, fCompact, fUnique );
        Abc_NtkDelete( pTemp );
    }
    else
        Io_WriteAiger( pAbc->pNtkCur, pFileName, fWriteSymbols, fCompact, fUnique );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_aiger [-scuvh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the network in the AIGER format (http://fmv.jku.at/aiger)\n" );
    fprintf( pAbc->Err, "\t-s     : toggle saving I/O names [default = %s]\n", fWriteSymbols? "yes" : "no" );
    fprintf( pAbc->Err, "\t-c     : toggle writing more compactly [default = %s]\n", fCompact? "yes" : "no" );
    fprintf( pAbc->Err, "\t-u     : toggle writing canonical AIG structure [default = %s]\n", fUnique? "yes" : "no" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write (extension .aig)\n" );
    return 1;
}